

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall indk::NeuralNet::setStructure(NeuralNet *this,ifstream *Stream)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  string rstr;
  string jstr;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    iVar2 = System::getVerbosityLevel();
    if (0 < iVar2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error opening file");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    while (((byte)Stream[*(long *)(*(long *)Stream + -0x18) + 0x20] & 2) == 0) {
      local_60 = 0;
      local_58[0] = 0;
      local_68 = local_58;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)Stream,(string *)&local_68);
      std::__cxx11::string::append((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    setStructure(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void indk::NeuralNet::setStructure(std::ifstream &Stream) {
    if (!Stream.is_open()) {
        if (indk::System::getVerbosityLevel() > 0) std::cerr << "Error opening file" << std::endl;
        return;
    }
    std::string jstr;
    while (!Stream.eof()) {
        std::string rstr;
        getline(Stream, rstr);
        jstr.append(rstr);
    }
    setStructure(jstr);
}